

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

bool __thiscall
ByteCodeGenerator::EnsureSymbolModuleSlots(ByteCodeGenerator *this,Symbol *sym,FuncInfo *funcInfo)

{
  short sVar1;
  JavascriptLibrary *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  PropertyId localName;
  uint uVar5;
  int iVar6;
  ModuleNameRecord *in_RAX;
  undefined4 *puVar7;
  SourceTextModuleRecord *pSVar8;
  undefined7 extraout_var;
  uint moduleId;
  ModuleNameRecord *local_38;
  ModuleNameRecord *moduleNameRecord;
  
  if ((sym->field_0x43 & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    local_38 = in_RAX;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xf20,"(sym->GetIsModuleExportStorage())","sym->GetIsModuleExportStorage()")
    ;
    if (!bVar3) goto LAB_00817242;
    *puVar7 = 0;
  }
  if ((sym->moduleIndex == -1) || (sym->scopeSlot == -1)) {
    this_00 = (this->scriptContext->super_ScriptContextBase).javascriptLibrary;
    Js::JavascriptLibrary::EnsureModuleRecordList(this_00);
    moduleId = ((this->m_utf8SourceInfo->m_srcInfo).ptr)->moduleID;
    pSVar8 = Js::JavascriptLibrary::GetModuleRecord(this_00,moduleId);
    sVar1 = *(short *)&sym->field_0x42;
    localName = Symbol::EnsurePosition(sym,funcInfo);
    if (sVar1 < 0) {
      local_38 = (ModuleNameRecord *)0x0;
      bVar3 = Js::SourceTextModuleRecord::ResolveImport(pSVar8,localName,&local_38);
      uVar5 = (uint)CONCAT71(extraout_var,bVar3);
      if (bVar3) {
        if (local_38 == (ModuleNameRecord *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0xf36,"(moduleNameRecord != nullptr)","moduleNameRecord != nullptr");
          if (!bVar4) goto LAB_00817242;
          *puVar7 = 0;
        }
        iVar6 = (*(((local_38->module).ptr)->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0xd])();
        if ((char)iVar6 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0xf37,"(moduleNameRecord->module->IsSourceTextModuleRecord())",
                             "moduleNameRecord->module->IsSourceTextModuleRecord()");
          if (!bVar4) {
LAB_00817242:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
        pSVar8 = (SourceTextModuleRecord *)(local_38->module).ptr;
        moduleId = pSVar8->moduleId;
        uVar5 = Js::SourceTextModuleRecord::GetLocalExportSlotIndexByLocalName
                          (pSVar8,local_38->bindingName);
      }
      if (!bVar3) {
        return false;
      }
    }
    else {
      uVar5 = Js::SourceTextModuleRecord::GetLocalExportSlotIndexByLocalName(pSVar8,localName);
    }
    sym->moduleIndex = moduleId;
    sym->scopeSlot = uVar5;
  }
  return true;
}

Assistant:

bool ByteCodeGenerator::EnsureSymbolModuleSlots(Symbol* sym, FuncInfo* funcInfo)
{
    Assert(sym->GetIsModuleExportStorage());

    if (sym->GetModuleIndex() != Js::Constants::NoProperty && sym->GetScopeSlot() != Js::Constants::NoProperty)
    {
        return true;
    }

    Js::JavascriptLibrary* library = this->GetScriptContext()->GetLibrary();
    library->EnsureModuleRecordList();
    uint moduleIndex = this->GetModuleID();
    uint moduleSlotIndex;
    Js::SourceTextModuleRecord* moduleRecord = library->GetModuleRecord(moduleIndex);

    if (sym->GetIsModuleImport())
    {
        Js::PropertyId localImportNameId = sym->EnsurePosition(funcInfo);
        Js::ModuleNameRecord* moduleNameRecord = nullptr;
        if (!moduleRecord->ResolveImport(localImportNameId, &moduleNameRecord))
        {
            return false;
        }

        AnalysisAssert(moduleNameRecord != nullptr);
        Assert(moduleNameRecord->module->IsSourceTextModuleRecord());
        Js::SourceTextModuleRecord* resolvedModuleRecord =
            (Js::SourceTextModuleRecord*)PointerValue(moduleNameRecord->module);

        moduleIndex = resolvedModuleRecord->GetModuleId();
        moduleSlotIndex = resolvedModuleRecord->GetLocalExportSlotIndexByLocalName(moduleNameRecord->bindingName);
    }
    else
    {
        Js::PropertyId exportNameId = sym->EnsurePosition(funcInfo);
        moduleSlotIndex = moduleRecord->GetLocalExportSlotIndexByLocalName(exportNameId);
    }

    sym->SetModuleIndex(moduleIndex);
    sym->SetScopeSlot(moduleSlotIndex);

    return true;
}